

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestStatus *pTVar1;
  deUint32 dVar2;
  ThreadGroupThread *this;
  uint uVar3;
  Parameters *extraout_RDX;
  uint uVar4;
  ThreadGroup threads;
  Environment env;
  Resources res;
  undefined1 local_151;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_150;
  TestStatus *local_140;
  ThreadGroup local_138;
  Environment local_108;
  Resources local_d0;
  
  local_140 = __return_storage_ptr__;
  dVar2 = deGetNumAvailableLogicalCores();
  uVar3 = 8;
  if (dVar2 < 8) {
    uVar3 = dVar2;
  }
  uVar4 = 2;
  if (2 < uVar3) {
    uVar4 = uVar3;
  }
  local_108.vkp = context->m_platformInterface;
  local_108.vkd = Context::getDeviceInterface(context);
  local_108.device = Context::getDevice(context);
  local_108.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_108.programBinaries = context->m_progCollection;
  local_108.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_108.maxResourceConsumers = uVar4;
  ComputePipeline::Resources::Resources(&local_d0,&local_108,extraout_RDX);
  ThreadGroup::ThreadGroup(&local_138);
  do {
    this = (ThreadGroupThread *)operator_new(0x88);
    ThreadGroupThread::ThreadGroupThread(this);
    (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00ceeae0;
    this[1].super_Thread._vptr_Thread = (_func_int **)&local_108;
    *(Resources **)&this[1].super_Thread.m_attribs = &local_d0;
    this[1].super_Thread.m_thread = (deThread)&local_151;
    local_150.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this;
    ThreadGroup::add(&local_138,&local_150);
    if (local_150.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_150.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_150.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    pTVar1 = local_140;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  ThreadGroup::run(local_140,&local_138);
  de::SpinBarrier::~SpinBarrier(&local_138.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_138.m_threads);
  ComputePipeline::Resources::~Resources(&local_d0);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}